

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  uint uVar6;
  ParseContext *ctx_00;
  byte *p;
  RepeatedField<unsigned_int> *this;
  char *pcVar7;
  uint *puVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  
  puVar8 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar8 & 3) == 0) {
    this = (RepeatedField<unsigned_int> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar8);
    if (((ulong)this & 7) != 0) {
      AlignFail(this);
    }
    uVar3 = *(undefined8 *)
             ((long)&table->has_bits_offset +
             (ulong)(ushort)puVar8[2] * 8 + (ulong)table->aux_offset);
    do {
      pcVar7 = (char *)(long)*ptr;
      if ((long)pcVar7 < 0) {
        aVar5.data = (long)ptr[1] << 7 | 0x7f;
        if ((long)aVar5 < 0) {
          ctx_00 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
          if ((long)ctx_00 < 0) {
            aVar5.data = aVar5.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
            if ((long)aVar5 < 0) {
              ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[4] << 0x1c | 0xfffffffU));
              if ((long)ctx_00 < 0) {
                aVar5.data = aVar5.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
                if ((long)aVar5 < 0) {
                  ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU))
                  ;
                  if ((long)ctx_00 < 0) {
                    aVar5.data = aVar5.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                    if ((long)aVar5 < 0) {
                      ctx_00 = (ParseContext *)
                               ((ulong)ctx_00 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                      if ((long)ctx_00 < 0) {
                        p = (byte *)(ptr + 10);
                        if ((ptr[9] != '\x01') && (ptr[9] < '\0')) goto LAB_00284058;
                      }
                      else {
                        p = (byte *)(ptr + 9);
                      }
                    }
                    else {
                      p = (byte *)(ptr + 8);
                    }
                  }
                  else {
                    p = (byte *)(ptr + 7);
                  }
                }
                else {
                  p = (byte *)(ptr + 6);
                }
              }
              else {
                p = (byte *)(ptr + 5);
              }
            }
            else {
              p = (byte *)(ptr + 4);
            }
          }
          else {
            p = (byte *)(ptr + 3);
          }
          aVar5.data = aVar5.data & (ulong)ctx_00;
        }
        else {
          p = (byte *)(ptr + 2);
        }
        pcVar7 = (char *)((ulong)pcVar7 & aVar5.data);
      }
      else {
        p = (byte *)(ptr + 1);
      }
      uVar6 = (uint)pcVar7;
      if (((int)uVar6 < (int)uVar3) || ((int)((ulong)uVar3 >> 0x20) < (int)uVar6)) {
        pcVar7 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar7;
      }
      RepeatedField<unsigned_int>::Add(this,uVar6);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) break;
      bVar1 = *p;
      auVar4[8] = bVar1;
      auVar4._0_8_ = p + 1;
      auVar4._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = p[1];
        aVar5.data = (ulong)bVar2 << 7;
        uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar6;
          pVar9 = ReadTagFallback((char *)p,uVar6);
          auVar4 = pVar9._0_12_;
          ctx_00 = pVar9._8_8_;
          if (pVar9.first == (char *)0x0) {
LAB_00284058:
            pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar5,table,hasbits);
            return pcVar7;
          }
        }
        else {
          auVar4._8_4_ = uVar6;
          auVar4._0_8_ = p + 2;
        }
      }
      ptr = auVar4._0_8_;
    } while (auVar4._8_4_ == data.field_0._0_4_);
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar8 & 3) != 0) goto LAB_00284079;
      *puVar8 = *puVar8 | (uint)hasbits;
    }
    return (char *)p;
  }
LAB_00284079:
  AlignFail();
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}